

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_colorized_console.cpp
# Opt level: O0

bool crnlib::colorized_console::console_output_func
               (eConsoleMessageType type,char *pMsg,void *param_3)

{
  bool bVar1;
  void *param_2_local;
  char *pMsg_local;
  eConsoleMessageType type_local;
  
  bVar1 = console::get_output_disabled();
  if (!bVar1) {
    bVar1 = console::get_prefixes();
    if ((bVar1) && (bVar1 = console::get_at_beginning_of_line(), bVar1)) {
      if (type == cDebugConsoleMessage) {
        printf("Debug: %s",pMsg);
      }
      else if (type == cWarningConsoleMessage) {
        printf("Warning: %s",pMsg);
      }
      else if (type == cErrorConsoleMessage) {
        printf("Error: %s",pMsg);
      }
      else {
        printf("%s",pMsg);
      }
    }
    else {
      printf("%s",pMsg);
    }
    bVar1 = console::get_crlf();
    if (bVar1) {
      printf("\n");
    }
  }
  return true;
}

Assistant:

bool colorized_console::console_output_func(eConsoleMessageType type, const char* pMsg, void*)
    {
        if (console::get_output_disabled())
        {
            return true;
        }

        if ((console::get_prefixes()) && (console::get_at_beginning_of_line()))
        {
            switch (type)
            {
            case cDebugConsoleMessage:
                printf("Debug: %s", pMsg);
                break;
            case cWarningConsoleMessage:
                printf("Warning: %s", pMsg);
                break;
            case cErrorConsoleMessage:
                printf("Error: %s", pMsg);
                break;
            default:
                printf("%s", pMsg);
                break;
            }
        }
        else
        {
            printf("%s", pMsg);
        }

        if (console::get_crlf())
        {
            printf("\n");
        }

        return true;
    }